

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CosId>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>
               *cfc)

{
  FunctionalConstraint *in_RSI;
  char *in_RDI;
  array<int,_1UL> *in_stack_ffffffffffffff58;
  array<int,_0UL> *o;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff60;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *w;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *this;
  array<int,_0UL> local_78 [16];
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  int local_14;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  local_14 = FunctionalConstraint::GetResultVar(in_RSI);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_RDI);
  this = &local_28;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58->_M_elems);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3ce523);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,in_RDI);
  w = (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
      &stack0xffffffffffffffa8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::CosId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::CosId> *)
             (local_10 + 1));
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>>
            (w,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3ce57c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,in_RDI);
  o = local_78;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::CosId>::GetParameters
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::CosId> *)
             (local_10 + 1));
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,0ul>>
            (w,o);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3ce5d3);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const CustomFunctionalConstraint<A,P,N,I>& cfc) {
  jw["res_var"] = cfc.GetResultVar();
  WriteJSON(jw["args"], cfc.GetArguments());
  WriteJSON(jw["params"], cfc.GetParameters());
}